

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackSTGZGenerator.cxx
# Opt level: O2

int __thiscall cmCPackSTGZGenerator::InitializeInternal(cmCPackSTGZGenerator *this)

{
  cmCPackLog *this_00;
  int iVar1;
  ostream *poVar2;
  char *local_1c8 [4];
  string inFile;
  ostringstream cmCPackLog_msg;
  
  std::__cxx11::string::string
            ((string *)&cmCPackLog_msg,"CPACK_INCLUDE_TOPLEVEL_DIRECTORY",(allocator *)&inFile);
  cmCPackGenerator::SetOptionIfNotSet((cmCPackGenerator *)this,(string *)&cmCPackLog_msg,"0");
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  (*(this->super_cmCPackTGZGenerator).super_cmCPackArchiveGenerator.super_cmCPackGenerator.
    _vptr_cmCPackGenerator[0xc])(&inFile,this,"CPack.STGZ_Header.sh.in");
  if (inFile._M_string_length == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar2 = std::operator<<((ostream *)&cmCPackLog_msg,"Cannot find template file: ");
    poVar2 = std::operator<<(poVar2,(string *)&inFile);
    std::endl<char,std::char_traits<char>>(poVar2);
    this_00 = (this->super_cmCPackTGZGenerator).super_cmCPackArchiveGenerator.super_cmCPackGenerator
              .Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(this_00,0x10,
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CPack/cmCPackSTGZGenerator.cxx"
                    ,0x1f,local_1c8[0]);
    std::__cxx11::string::~string((string *)local_1c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    iVar1 = 0;
  }
  else {
    std::__cxx11::string::string
              ((string *)&cmCPackLog_msg,"CPACK_STGZ_HEADER_FILE",(allocator *)local_1c8);
    cmCPackGenerator::SetOptionIfNotSet
              ((cmCPackGenerator *)this,(string *)&cmCPackLog_msg,inFile._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    std::__cxx11::string::string((string *)&cmCPackLog_msg,"CPACK_AT_SIGN",(allocator *)local_1c8);
    cmCPackGenerator::SetOptionIfNotSet((cmCPackGenerator *)this,(string *)&cmCPackLog_msg,"@");
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    iVar1 = cmCPackArchiveGenerator::InitializeInternal((cmCPackArchiveGenerator *)this);
  }
  std::__cxx11::string::~string((string *)&inFile);
  return iVar1;
}

Assistant:

int cmCPackSTGZGenerator::InitializeInternal()
{
  this->SetOptionIfNotSet("CPACK_INCLUDE_TOPLEVEL_DIRECTORY", "0");

  std::string inFile = this->FindTemplate("CPack.STGZ_Header.sh.in");
  if (inFile.empty()) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Cannot find template file: " << inFile << std::endl);
    return 0;
  }
  this->SetOptionIfNotSet("CPACK_STGZ_HEADER_FILE", inFile.c_str());
  this->SetOptionIfNotSet("CPACK_AT_SIGN", "@");

  return this->Superclass::InitializeInternal();
}